

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

void __thiscall testing::internal::MutexBase::AssertHeld(MutexBase *this)

{
  pthread_t __thread1;
  int iVar1;
  pthread_t __thread2;
  ostream *poVar2;
  GTestLog local_14;
  
  if (this->has_owner_ == true) {
    __thread1 = this->owner_;
    __thread2 = pthread_self();
    iVar1 = pthread_equal(__thread1,__thread2);
    if (iVar1 != 0) {
      return;
    }
  }
  GTestLog::GTestLog(&local_14,GTEST_FATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/scientific-systems[P]fmt/test/gtest/gtest.h"
                     ,0x9a1);
  poVar2 = std::operator<<((ostream *)&std::cerr,
                           "Condition has_owner_ && pthread_equal(owner_, pthread_self()) failed. ")
  ;
  poVar2 = std::operator<<(poVar2,"The current thread is not holding the mutex @");
  std::ostream::_M_insert<void_const*>(poVar2);
  GTestLog::~GTestLog(&local_14);
  return;
}

Assistant:

void AssertHeld() const {
    GTEST_CHECK_(has_owner_ && pthread_equal(owner_, pthread_self()))
        << "The current thread is not holding the mutex @" << this;
  }